

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_vadd(SAM_hdr *sh,char *type,__va_list_tag *ap,...)

{
  uint uVar1;
  string_alloc_t *psVar2;
  char in_AL;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_1d0;
  long *local_1b8;
  undefined8 *local_198;
  long *local_180;
  undefined1 local_168 [24];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  uint local_b0;
  int local_ac;
  int itype;
  int idx_1;
  char *v_1;
  char *k_2;
  char *pcStack_90;
  int idx;
  char *v;
  char *k_1;
  SAM_hdr_type *p;
  SAM_hdr_type *t;
  uint local_68;
  khint32_t k;
  khint32_t type_i;
  int new;
  SAM_hdr_tag *last;
  SAM_hdr_tag *h_tag;
  SAM_hdr_type *h_type;
  va_list args;
  __va_list_tag *ap_local;
  char *type_local;
  SAM_hdr *sh_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  local_68 = (int)*type << 8 | (int)type[1];
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  iVar3 = kputc_(0x40,&sh->text);
  if ((((iVar3 != -1) && (iVar3 = kputsn(type,2,&sh->text), iVar3 != -1)) &&
      (h_tag = (SAM_hdr_tag *)pool_alloc(sh->type_pool), h_tag != (SAM_hdr_tag *)0x0)) &&
     (t._4_4_ = kh_put_sam_hdr(sh->h,local_68,(int *)&k), t._4_4_ != 0xffffffff)) {
    sh->h->vals[t._4_4_] = (SAM_hdr_type *)h_tag;
    if (k == 0) {
      p = sh->h->vals[t._4_4_];
      k_1 = (char *)p->prev;
      ((SAM_hdr_item_s *)k_1)->next = p;
      if (p == (SAM_hdr_type *)0x0) {
        __assert_fail("p->next = t",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/sam_header.c"
                      ,0x1bd,
                      "int sam_hdr_vadd(SAM_hdr *, const char *, struct __va_list_tag *, ...)");
      }
      ((SAM_hdr_item_s *)k_1)->next = (SAM_hdr_item_s *)h_tag;
      h_tag->str = k_1;
      p->prev = (SAM_hdr_item_s *)h_tag;
      h_tag->next = (SAM_hdr_tag_s *)p;
      *(int *)&h_tag[1].next = ((SAM_hdr_item_s *)k_1)->order + 1;
    }
    else {
      h_tag->next = h_tag;
      h_tag->str = (char *)h_tag;
      *(undefined4 *)&h_tag[1].next = 0;
    }
    _type_i = (SAM_hdr_tag *)0x0;
    args[0].overflow_arg_area = local_168;
    args[0]._0_8_ = &stack0x00000008;
    h_type._4_4_ = 0x30;
    h_type._0_4_ = 0x18;
    while( true ) {
      if ((uint)h_type < 0x29) {
        local_180 = (long *)((long)(int)(uint)h_type + (long)args[0].overflow_arg_area);
        h_type._0_4_ = (uint)h_type + 8;
      }
      else {
        local_180 = (long *)args[0]._0_8_;
        args[0]._0_8_ = args[0]._0_8_ + 8;
      }
      v = (char *)*local_180;
      if (v == (char *)0x0) {
        v = (char *)0x0;
        while( true ) {
          uVar1 = ap->gp_offset;
          if (uVar1 < 0x29) {
            local_1b8 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            local_1b8 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_1b8 + 1;
          }
          v_1 = (char *)*local_1b8;
          if (v_1 == (char *)0x0) {
            iVar3 = kputc(10,&sh->text);
            if (iVar3 == -1) {
              return -1;
            }
            local_b0 = (int)*type << 8 | (int)type[1];
            iVar3 = sam_hdr_update_hashes(sh,local_b0,(SAM_hdr_type *)h_tag);
            if (iVar3 != -1) {
              return *(int *)&h_tag[1].next;
            }
            return -1;
          }
          uVar1 = ap->gp_offset;
          if (uVar1 < 0x29) {
            local_1d0 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            local_1d0 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = local_1d0 + 1;
          }
          _itype = (char *)*local_1d0;
          iVar3 = kputc_(9,&sh->text);
          if (iVar3 == -1) {
            return -1;
          }
          last = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
          if (last == (SAM_hdr_tag *)0x0) {
            return -1;
          }
          sVar4 = ks_len(&sh->text);
          local_ac = (int)sVar4;
          iVar3 = kputs(v_1,&sh->text);
          if (iVar3 == -1) break;
          iVar3 = kputc_(0x3a,&sh->text);
          if (iVar3 == -1) {
            return -1;
          }
          iVar3 = kputs(_itype,&sh->text);
          if (iVar3 == -1) {
            return -1;
          }
          sVar4 = ks_len(&sh->text);
          last->len = (int)sVar4 - local_ac;
          psVar2 = sh->str_pool;
          pcVar5 = ks_str(&sh->text);
          pcVar5 = string_ndup(psVar2,pcVar5 + local_ac,(long)last->len);
          last->str = pcVar5;
          last->next = (SAM_hdr_tag_s *)0x0;
          if (last->str == (char *)0x0) {
            return -1;
          }
          if (_type_i == (SAM_hdr_tag *)0x0) {
            *(SAM_hdr_tag **)&h_tag->len = last;
          }
          else {
            _type_i->next = last;
          }
          _type_i = last;
        }
        return -1;
      }
      if ((uint)h_type < 0x29) {
        local_198 = (undefined8 *)((long)(int)(uint)h_type + (long)args[0].overflow_arg_area);
        h_type._0_4_ = (uint)h_type + 8;
      }
      else {
        local_198 = (undefined8 *)args[0]._0_8_;
        args[0]._0_8_ = args[0]._0_8_ + 8;
      }
      pcStack_90 = (char *)*local_198;
      iVar3 = kputc_(9,&sh->text);
      if (iVar3 == -1) {
        return -1;
      }
      last = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
      if (last == (SAM_hdr_tag *)0x0) {
        return -1;
      }
      sVar4 = ks_len(&sh->text);
      k_2._4_4_ = (int)sVar4;
      iVar3 = kputs(v,&sh->text);
      if (iVar3 == -1) {
        return -1;
      }
      iVar3 = kputc_(0x3a,&sh->text);
      if (iVar3 == -1) {
        return -1;
      }
      iVar3 = kputs(pcStack_90,&sh->text);
      if (iVar3 == -1) {
        return -1;
      }
      sVar4 = ks_len(&sh->text);
      last->len = (int)sVar4 - k_2._4_4_;
      psVar2 = sh->str_pool;
      pcVar5 = ks_str(&sh->text);
      pcVar5 = string_ndup(psVar2,pcVar5 + k_2._4_4_,(long)last->len);
      last->str = pcVar5;
      last->next = (SAM_hdr_tag_s *)0x0;
      if (last->str == (char *)0x0) break;
      if (_type_i == (SAM_hdr_tag *)0x0) {
        *(SAM_hdr_tag **)&h_tag->len = last;
      }
      else {
        _type_i->next = last;
      }
      _type_i = last;
    }
  }
  return -1;
}

Assistant:

int sam_hdr_vadd(SAM_hdr *sh, const char *type, va_list ap, ...) {
    va_list args;
    SAM_hdr_type *h_type;
    SAM_hdr_tag *h_tag, *last;
    int new;
    khint32_t type_i = (type[0]<<8) | type[1], k;

#if defined(HAVE_VA_COPY)
    va_list ap_local;
#endif

    if (EOF == kputc_('@', &sh->text))
	return -1;
    if (EOF == kputsn(type, 2, &sh->text))
	return -1;

    if (!(h_type = pool_alloc(sh->type_pool)))
	return -1;
    if (-1 == (k = kh_put(sam_hdr, sh->h, type_i, &new)))
	return -1;
    kh_val(sh->h, k) = h_type;

    // Form the ring, either with self or other lines of this type
    if (!new) {
	SAM_hdr_type *t = kh_val(sh->h, k), *p;
	p = t->prev;
	    
	assert(p->next = t);
	p->next = h_type;
	h_type->prev = p;

	t->prev = h_type;
	h_type->next = t;
	h_type->order = p->order + 1;
    } else {
	h_type->prev = h_type->next = h_type;
	h_type->order = 0;
    }

    last = NULL;

    // Any ... varargs
    va_start(args, ap);
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(args, char *)))
	    break;
	v = va_arg(args, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(args);

#if defined(HAVE_VA_COPY)
    va_copy(ap_local, ap);
#   define ap ap_local
#endif

    // Plus the specified va_list params
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(ap);

    if (EOF == kputc('\n', &sh->text))
	return -1;

    int itype = (type[0]<<8) | type[1];
    if (-1 == sam_hdr_update_hashes(sh, itype, h_type))
	return -1;

    return h_type->order;
}